

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_passphrase.c
# Opt level: O1

int archive_write_set_passphrase(archive *_a,char *p)

{
  int iVar1;
  int iVar2;
  archive_vtable_conflict *paVar3;
  
  iVar1 = __archive_check_magic(_a,0xb0c5c0de,1,"archive_write_set_passphrase");
  iVar2 = -0x1e;
  if (iVar1 != -0x1e) {
    if ((p == (char *)0x0) || (*p == '\0')) {
      archive_set_error(_a,-1,"Empty passphrase is unacceptable");
      iVar2 = -0x19;
    }
    else {
      free(_a[2].vtable);
      paVar3 = (archive_vtable_conflict *)strdup(p);
      _a[2].vtable = paVar3;
      iVar2 = 0;
      if (paVar3 == (archive_vtable_conflict *)0x0) {
        archive_set_error(_a,0xc,"Can\'t allocate data for passphrase");
        iVar2 = -0x1e;
      }
    }
  }
  return iVar2;
}

Assistant:

int
archive_write_set_passphrase(struct archive *_a, const char *p)
{
	struct archive_write *a = (struct archive_write *)_a;

	archive_check_magic(_a, ARCHIVE_WRITE_MAGIC, ARCHIVE_STATE_NEW,
		"archive_write_set_passphrase");

	if (p == NULL || p[0] == '\0') {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Empty passphrase is unacceptable");
		return (ARCHIVE_FAILED);
	}
	free(a->passphrase);
	a->passphrase = strdup(p);
	if (a->passphrase == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate data for passphrase");
		return (ARCHIVE_FATAL);
	}
	return (ARCHIVE_OK);
}